

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O2

int __thiscall btMultiBodyPoint2Point::getIslandIdB(btMultiBodyPoint2Point *this)

{
  uint uVar1;
  btMultiBody *pbVar2;
  ulong uVar3;
  ulong uVar4;
  btRigidBody *pbVar5;
  
  pbVar5 = this->m_rigidBodyB;
  if (pbVar5 == (btRigidBody *)0x0) {
    pbVar2 = (this->super_btMultiBodyConstraint).m_bodyB;
    if (pbVar2 == (btMultiBody *)0x0) {
      return -1;
    }
    pbVar5 = (btRigidBody *)pbVar2->m_baseCollider;
    if (pbVar5 == (btRigidBody *)0x0) {
      uVar1 = (pbVar2->m_links).m_size;
      uVar4 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar4 = 0;
      }
      uVar3 = 0;
      do {
        if (uVar4 * 600 + 600 == uVar3 + 600) {
          return -1;
        }
        pbVar5 = *(btRigidBody **)((long)((pbVar2->m_links).m_data)->m_jointTorque + uVar3 + 0x1c);
        uVar3 = uVar3 + 600;
      } while (pbVar5 == (btRigidBody *)0x0);
    }
  }
  return (pbVar5->super_btCollisionObject).m_islandTag1;
}

Assistant:

int btMultiBodyPoint2Point::getIslandIdB() const
{
	if (m_rigidBodyB)
		return m_rigidBodyB->getIslandTag();
	if (m_bodyB)
	{
		btMultiBodyLinkCollider* col = m_bodyB->getBaseCollider();
		if (col)
			return col->getIslandTag();

		for (int i=0;i<m_bodyB->getNumLinks();i++)
		{
			col = m_bodyB->getLink(i).m_collider;
			if (col)
				return col->getIslandTag();
		}
	}
	return -1;
}